

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

void __thiscall QtMWidgets::PickerPrivate::normalizeOffset(PickerPrivate *this)

{
  int iVar1;
  int iVar2;
  int local_3c;
  int local_24;
  int local_20;
  int i_1;
  int i;
  int fullItemsCount;
  int maxOffset;
  int freeItemsCount;
  PickerPrivate *this_local;
  
  iVar1 = Picker::count(this->q);
  if (iVar1 < this->itemsCount) {
    iVar1 = this->itemsCount;
    iVar2 = Picker::count(this->q);
    iVar1 = iVar1 - iVar2;
    if (iVar1 < 1) {
      local_3c = 0;
    }
    else {
      local_3c = iVar1 + -1;
    }
    iVar1 = iVar1 * this->stringHeight + local_3c * this->itemTopMargin;
    if (this->drawItemOffset < 0) {
      this->drawItemOffset = 0;
    }
    else if (iVar1 < this->drawItemOffset) {
      this->drawItemOffset = iVar1;
    }
  }
  else {
    local_20 = this->drawItemOffset / (this->itemTopMargin + this->stringHeight);
    this->drawItemOffset =
         this->drawItemOffset - (this->itemTopMargin + this->stringHeight) * local_20;
    if (local_20 < 0) {
      for (; local_20 < 0; local_20 = local_20 + 1) {
        makeNextIndex(this,&this->topItemIndex);
      }
    }
    else if (0 < local_20) {
      for (local_24 = 0; local_24 < local_20; local_24 = local_24 + 1) {
        makePrevIndex(this,&this->topItemIndex);
      }
    }
    if (0 < this->drawItemOffset) {
      this->drawItemOffset = this->drawItemOffset - (this->itemTopMargin + this->stringHeight);
      makePrevIndex(this,&this->topItemIndex);
    }
  }
  return;
}

Assistant:

void
PickerPrivate::normalizeOffset()
{
	if( q->count() < itemsCount )
	{
		const int freeItemsCount = ( itemsCount - q->count() );

		const int maxOffset = freeItemsCount * stringHeight +
			( freeItemsCount > 0 ? freeItemsCount - 1 : 0 ) * itemTopMargin;

		if( drawItemOffset < 0 )
			drawItemOffset = 0;
		else if( drawItemOffset > maxOffset )
			drawItemOffset = maxOffset;
	}
	else
	{
		int fullItemsCount = drawItemOffset /
			( itemTopMargin + stringHeight );

		drawItemOffset -= ( itemTopMargin + stringHeight ) * fullItemsCount;

		if( fullItemsCount < 0 )
		{
			for( int i = fullItemsCount; i < 0; ++i )
				makeNextIndex( topItemIndex );
		}
		else if( fullItemsCount > 0 )
		{
			for( int i = 0; i < fullItemsCount; ++i )
				makePrevIndex( topItemIndex );
		}

		if( drawItemOffset > 0 )
		{
			drawItemOffset -= ( itemTopMargin + stringHeight );
			makePrevIndex( topItemIndex );
		}
	}
}